

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void closePendingFds(unixFile *pFile)

{
  unixInodeInfo *puVar1;
  UnixUnusedFd *pUVar2;
  UnixUnusedFd *pNext;
  UnixUnusedFd *p;
  unixInodeInfo *pInode;
  unixFile *pFile_local;
  
  puVar1 = pFile->pInode;
  pNext = puVar1->pUnused;
  while (pNext != (UnixUnusedFd *)0x0) {
    pUVar2 = pNext->pNext;
    robust_close(pFile,pNext->fd,0x835c);
    sqlite3_free(pNext);
    pNext = pUVar2;
  }
  puVar1->pUnused = (UnixUnusedFd *)0x0;
  return;
}

Assistant:

static void closePendingFds(unixFile *pFile){
  unixInodeInfo *pInode = pFile->pInode;
  UnixUnusedFd *p;
  UnixUnusedFd *pNext;
  assert( unixFileMutexHeld(pFile) );
  for(p=pInode->pUnused; p; p=pNext){
    pNext = p->pNext;
    robust_close(pFile, p->fd, __LINE__);
    sqlite3_free(p);
  }
  pInode->pUnused = 0;
}